

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser.cpp
# Opt level: O0

void __thiscall CLaser::Snap(CLaser *this,int SnappingClient)

{
  int iVar1;
  uint uVar2;
  IServer *pIVar3;
  int *piVar4;
  int in_ESI;
  CEntity *in_RDI;
  long in_FS_OFFSET;
  CNetObj_Laser *pObj;
  undefined8 in_stack_ffffffffffffffc8;
  CEntity *this_00;
  vec2 CheckPos;
  undefined4 extraout_var;
  
  CheckPos = *(vec2 *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  iVar1 = CEntity::NetworkClipped(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if ((iVar1 == 0) || (iVar1 = CEntity::NetworkClipped(this_00,in_ESI,CheckPos), iVar1 == 0)) {
    pIVar3 = CEntity::Server((CEntity *)0x11cfe8);
    uVar2 = CEntity::GetID(in_RDI);
    iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])(pIVar3,3,(ulong)uVar2,0x14);
    piVar4 = (int *)CONCAT44(extraout_var,iVar1);
    if (piVar4 != (int *)0x0) {
      iVar1 = round_to_int((in_RDI->m_Pos).field_0.x);
      *piVar4 = iVar1;
      iVar1 = round_to_int((in_RDI->m_Pos).field_1.y);
      piVar4[1] = iVar1;
      iVar1 = round_to_int(*(float *)&in_RDI[1]._vptr_CEntity);
      piVar4[2] = iVar1;
      iVar1 = round_to_int(*(float *)((long)&in_RDI[1]._vptr_CEntity + 4));
      piVar4[3] = iVar1;
      piVar4[4] = *(int *)&in_RDI[1].m_pNextTypeEntity;
    }
  }
  if (*(vec2 *)(in_FS_OFFSET + 0x28) != CheckPos) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLaser::Snap(int SnappingClient)
{
	if(NetworkClipped(SnappingClient) && NetworkClipped(SnappingClient, m_From))
		return;

	CNetObj_Laser *pObj = static_cast<CNetObj_Laser *>(Server()->SnapNewItem(NETOBJTYPE_LASER, GetID(), sizeof(CNetObj_Laser)));
	if(!pObj)
		return;

	pObj->m_X = round_to_int(m_Pos.x);
	pObj->m_Y = round_to_int(m_Pos.y);
	pObj->m_FromX = round_to_int(m_From.x);
	pObj->m_FromY = round_to_int(m_From.y);
	pObj->m_StartTick = m_EvalTick;
}